

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O0

void get_random_esis(int nESIs,uint32_t *ESIs)

{
  long lVar1;
  uint uVar2;
  undefined8 uStack_60;
  undefined4 auStack_58 [2];
  long local_50;
  uint local_48;
  char local_41;
  int hidx;
  int iStack_3c;
  _Bool retry;
  uint32_t proposed_value;
  int j;
  int i;
  uint32_t hempty;
  unsigned_long __vla_expr0;
  uint local_1c;
  uint32_t *puStack_18;
  int hashtab_sz;
  uint32_t *ESIs_local;
  int nESIs_local;
  
  __vla_expr0 = (unsigned_long)auStack_58;
  local_1c = nESIs * 3;
  _i = (ulong)local_1c;
  lVar1 = -(_i * 4 + 0xf & 0xfffffffffffffff0);
  local_50 = (long)auStack_58 + lVar1;
  j = -1;
  for (proposed_value = 0; (int)proposed_value < (int)local_1c; proposed_value = proposed_value + 1)
  {
    *(undefined4 *)(local_50 + (long)(int)proposed_value * 4) = 0xffffffff;
  }
  iStack_3c = 0;
  puStack_18 = ESIs;
  ESIs_local._4_4_ = nESIs;
  do {
    if (ESIs_local._4_4_ <= iStack_3c) {
      return;
    }
    do {
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10198b;
      uVar2 = rand();
      hidx = uVar2 & 0xffffff;
      local_48 = (uint)hidx % local_1c;
      local_41 = '\0';
      while (*(int *)(local_50 + (long)(int)local_48 * 4) != -1) {
        if (*(uint *)(local_50 + (long)(int)local_48 * 4) == hidx) {
          local_41 = '\x01';
          break;
        }
        local_48 = local_48 + 1;
        if (local_48 == local_1c) {
          local_48 = 0;
        }
      }
    } while (local_41 != '\0');
    *(int *)(local_50 + (long)(int)local_48 * 4) = hidx;
    puStack_18[iStack_3c] = hidx;
    iStack_3c = iStack_3c + 1;
  } while( true );
}

Assistant:

void get_random_esis(int nESIs, uint32_t* ESIs)
{
	/* We use a linear probing hashing table
	 * to detect collisions.
	 */
	int hashtab_sz = 3*nESIs;
	uint32_t hESIs[hashtab_sz];
	const uint32_t hempty = (uint32_t)-1;
	for (int i = 0; i < hashtab_sz; ++i)
		hESIs[i] = hempty;
	for (int j = 0; j < nESIs; ++j) {
		uint32_t proposed_value;
		bool retry;
		int hidx;
		do {
			proposed_value = rand() & 0xffffff;
			hidx = (int)(proposed_value % hashtab_sz);
			retry = false;
			while (hESIs[hidx] != hempty) {
				if (hESIs[hidx] == proposed_value) {
					retry = true;
					break;
				}
				if (++hidx == hashtab_sz) {
					hidx = 0;
				}
			}
		} while(retry);
		assert(hESIs[hidx] == hempty);
		hESIs[hidx] = proposed_value;
		ESIs[j] = proposed_value;
	}
}